

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesturemanager.cpp
# Opt level: O3

void __thiscall QGestureManager::QGestureManager(QGestureManager *this,QObject *parent)

{
  char cVar1;
  int iVar2;
  QGestureRecognizer *pQVar3;
  long in_FS_OFFSET;
  bool ok;
  char local_48 [24];
  char *local_30;
  bool local_21;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::QObject((QObject *)this,parent);
  *(undefined ***)this = &PTR_metaObject_007e6790;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined8 *)(this + 0x40) = 0;
  *(undefined4 *)(this + 0x48) = 0x100;
  *(undefined8 *)(this + 0x50) = 0;
  *(undefined8 *)(this + 0x58) = 0;
  *(undefined8 *)(this + 0x60) = 0;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<Qt::GestureState>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    QMetaType::registerHelper(&QtPrivate::QMetaTypeInterfaceWrapper<Qt::GestureState>::metaType);
  }
  pQVar3 = (QGestureRecognizer *)operator_new(0x10);
  cVar1 = qEnvironmentVariableIsSet("QT_PAN_TOUCHPOINTS");
  iVar2 = 2;
  if (cVar1 != '\0') {
    local_21 = true;
    iVar2 = qEnvironmentVariableIntValue("QT_PAN_TOUCHPOINTS",&local_21);
    if ((iVar2 < 1) || (local_21 == false)) {
      local_48[0] = '\x02';
      local_48[1] = '\0';
      local_48[2] = '\0';
      local_48[3] = '\0';
      local_48[4] = '\0';
      local_48[5] = '\0';
      local_48[6] = '\0';
      local_48[7] = '\0';
      local_48[8] = '\0';
      local_48[9] = '\0';
      local_48[10] = '\0';
      local_48[0xb] = '\0';
      local_48[0xc] = '\0';
      local_48[0xd] = '\0';
      local_48[0xe] = '\0';
      local_48[0xf] = '\0';
      local_48[0x10] = '\0';
      local_48[0x11] = '\0';
      local_48[0x12] = '\0';
      local_48[0x13] = '\0';
      local_48[0x14] = '\0';
      local_48[0x15] = '\0';
      local_48[0x16] = '\0';
      local_48[0x17] = '\0';
      local_30 = "default";
      QMessageLogger::warning(local_48,"Ignoring invalid value of %s","QT_PAN_TOUCHPOINTS");
      iVar2 = 2;
    }
  }
  QGestureRecognizer::QGestureRecognizer(pQVar3);
  pQVar3->_vptr_QGestureRecognizer = (_func_int **)&PTR__QGestureRecognizer_007e7570;
  *(int *)&pQVar3[1]._vptr_QGestureRecognizer = iVar2;
  registerGestureRecognizer(this,pQVar3);
  pQVar3 = (QGestureRecognizer *)operator_new(8);
  QPinchGestureRecognizer::QPinchGestureRecognizer((QPinchGestureRecognizer *)pQVar3);
  registerGestureRecognizer(this,pQVar3);
  pQVar3 = (QGestureRecognizer *)operator_new(8);
  QSwipeGestureRecognizer::QSwipeGestureRecognizer((QSwipeGestureRecognizer *)pQVar3);
  registerGestureRecognizer(this,pQVar3);
  pQVar3 = (QGestureRecognizer *)operator_new(8);
  QTapGestureRecognizer::QTapGestureRecognizer((QTapGestureRecognizer *)pQVar3);
  registerGestureRecognizer(this,pQVar3);
  pQVar3 = (QGestureRecognizer *)operator_new(8);
  QTapAndHoldGestureRecognizer::QTapAndHoldGestureRecognizer((QTapAndHoldGestureRecognizer *)pQVar3)
  ;
  registerGestureRecognizer(this,pQVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QGestureManager::QGestureManager(QObject *parent)
    : QObject(parent), m_lastCustomGestureId(Qt::CustomGesture)
{
    qRegisterMetaType<Qt::GestureState>();

#if defined(Q_OS_MACOS)
    registerGestureRecognizer(new QMacSwipeGestureRecognizer);
    registerGestureRecognizer(new QMacPinchGestureRecognizer);
    registerGestureRecognizer(new QMacPanGestureRecognizer);
#else
    registerGestureRecognizer(new QPanGestureRecognizer(panTouchPoints()));
    registerGestureRecognizer(new QPinchGestureRecognizer);
    registerGestureRecognizer(new QSwipeGestureRecognizer);
    registerGestureRecognizer(new QTapGestureRecognizer);
#endif
    registerGestureRecognizer(new QTapAndHoldGestureRecognizer);
}